

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::Task::Task(Task *this,OwnPromiseNode *nodeParam,TaskSet *taskSet)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  TaskSet *taskSet_local;
  OwnPromiseNode *nodeParam_local;
  Task *this_local;
  
  kj::_::PromiseArenaMember::PromiseArenaMember(&this->super_PromiseArenaMember);
  kj::_::Event::Event(&this->super_Event,taskSet->location);
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0059fad0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0059faf8;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::Maybe(&this->next);
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)0x0;
  this->taskSet = taskSet;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(nodeParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->node,other);
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->node);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->node);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

Task(_::OwnPromiseNode&& nodeParam, TaskSet& taskSet)
      : Event(taskSet.location), taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }